

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O3

void test_abs<signed_char>(uint length)

{
  ulong uVar1;
  int iVar2;
  undefined8 *puVar3;
  long lVar4;
  ulong uVar5;
  undefined1 *puVar6;
  undefined1 *local_30;
  undefined1 *local_28;
  shared_ptr<signed_char> pv;
  
  uVar1 = (ulong)length;
  iVar2 = posix_memalign(&local_30,0x40,(long)(int)length);
  if (iVar2 != 0) {
    local_30 = (undefined1 *)0x0;
  }
  local_28 = local_30;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<signed_char*,void(*)(signed_char*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv,local_30,
             sse::common::free<signed_char>);
  if (0 < (int)length) {
    lVar4 = 0;
    puVar6 = local_28;
    do {
      *puVar6 = (char)lVar4;
      lVar4 = lVar4 + -1;
      puVar6 = puVar6 + 1;
    } while (uVar1 + lVar4 != 0);
    if (0 < (int)length) {
      uVar5 = 0;
      do {
        if ((char)local_28[uVar5] < '\0') {
          local_28[uVar5] = -local_28[uVar5];
        }
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
      if (0 < (int)length) {
        uVar5 = 0;
        do {
          if (0x80 < (byte)local_28[uVar5]) {
            puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
            *puVar3 = "void test_abs(unsigned int) [T = signed char]";
            *(undefined4 *)(puVar3 + 1) = 0x81;
            *(uint *)((long)puVar3 + 0xc) = length;
            __cxa_throw(puVar3,&Exception::typeinfo,0);
          }
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
    }
  }
  if (pv.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}